

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

object * gc_move(mobject *ptr)

{
  ulong *puVar1;
  object *poVar2;
  object *poVar3;
  uintptr_t *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  object *poVar11;
  
  poVar11 = (object *)0x0;
LAB_0010a49a:
  poVar3 = memoryPointer;
  if (((ulong)ptr & 1) == 0) {
    if (((long)memoryBase <= (long)ptr) && ((long)ptr <= (long)memoryTop)) {
      error_impl("gc_move",0x99,
                 "gc_move(): GC invariant failure -- old address points to new space %p",ptr);
      goto LAB_0010a49a;
    }
    if (((long)oldBase <= (long)ptr) && ((long)ptr <= (long)oldTop)) {
      uVar6 = ((object *)ptr)->header;
      uVar9 = (uint)uVar6;
      if ((uVar6 & 1) != 0) {
        uVar7 = uVar6 >> 2 & 0x3fffffff;
        if ((uVar6 & 2) != 0) {
          uVar7 = 0;
        }
        ptr = (mobject *)(&((object *)ptr)->class)[uVar7];
        goto joined_r0x0010a5a6;
      }
      if ((uVar6 & 2) == 0) {
        uVar6 = uVar6 >> 2 & 0x3fffffff;
        lVar10 = (long)(int)(uVar9 * -2 + -0x10);
        poVar3 = (object *)((long)&memoryPointer->header + lVar10);
        puVar4 = &memoryPointer->header;
        memoryPointer = poVar3;
        *(ulong *)((long)puVar4 + lVar10) = (ulong)(uVar9 & 0xfffffffc);
        *(byte *)&((object *)ptr)->header = (byte)((object *)ptr)->header | 1;
        (&poVar3->class)[uVar6] = poVar11;
        poVar2 = (&((object *)ptr)->class)[uVar6];
        (&((object *)ptr)->class)[uVar6] = poVar3;
        poVar11 = (object *)ptr;
        ptr = (mobject *)poVar2;
      }
      else {
        uVar5 = ((uint)(uVar6 >> 2) & 0x3fffffff) + 7;
        uVar8 = uVar5 & 0xfffffff8;
        poVar2 = (object *)((long)memoryPointer + (-0x10 - (ulong)uVar8));
        puVar1 = (ulong *)((long)memoryPointer + (-0x10 - (ulong)uVar8));
        memoryPointer = poVar2;
        *puVar1 = (ulong)(uVar9 & 0xfffffffe);
        if (3 < uVar9) {
          uVar5 = uVar5 >> 3;
          do {
            *(object **)((long)poVar3 + (ulong)uVar5 * 8 + (-8 - (ulong)uVar8)) =
                 (&((object *)ptr)->class)[uVar5];
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
        *(byte *)&((object *)ptr)->header = (byte)((object *)ptr)->header | 1;
        *(object **)((long)poVar3 + (-8 - (ulong)uVar8)) = poVar11;
        poVar3 = ((object *)ptr)->class;
        ((object *)ptr)->class = poVar2;
        poVar11 = (object *)ptr;
        ptr = (mobject *)poVar3;
      }
      goto LAB_0010a49a;
    }
  }
joined_r0x0010a5a6:
  while( true ) {
    if (poVar11 == (object *)0x0) {
      return (object *)ptr;
    }
    uVar9 = (uint)poVar11->header;
    if ((poVar11->header & 2) == 0 && 3 < uVar9) break;
    poVar3 = poVar11->class;
    poVar2 = poVar3->class;
    poVar3->class = (object *)ptr;
    poVar11->class = poVar3;
    poVar11 = poVar2;
    ptr = (mobject *)poVar3;
  }
  uVar6 = (ulong)(uVar9 >> 2);
  poVar3 = (&poVar11->class)[uVar6];
  poVar2 = (&poVar3->class)[uVar6];
  (&poVar3->class)[uVar6] = (object *)ptr;
  uVar7 = 0;
  while( true ) {
    uVar9 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar9;
    if (uVar9 == 0) break;
    if ((&poVar11->class)[uVar9] != (object *)0x0) {
      uVar7 = (ulong)uVar9;
      break;
    }
    (&poVar3->class)[uVar9] = (object *)0x0;
  }
  poVar11->header = (ulong)((int)uVar7 * 4 + 1);
  (&poVar3->class)[uVar7] = poVar2;
  ptr = (mobject *)(&poVar11->class)[uVar7];
  (&poVar11->class)[uVar7] = poVar3;
  goto LAB_0010a49a;
}

Assistant:

static struct object *gc_move(struct mobject *ptr)
{
    struct mobject *old_address = ptr, *previous_object = 0,*new_address = 0, *replacement  = 0;
    int sz;

    while (1) {

        /*
         * part 1.  Walking down the tree
         * keep stacking objects to be moved until we find
         * one that we can handle
         */
        for (;;) {
            /*
             * SmallInt's are not proper memory pointers,
             * so catch them first.  Their "object pointer"
             * value can be used as-is in the new space.
             */
            if (IS_SMALLINT(old_address)) {
                replacement = old_address;
                old_address = previous_object;
                break;

                /*
                 * If we find a pointer in the current space
                 * to the new space (other than indirections) then
                 * something is very wrong
                 */
            } else if (IN_NEWSPACE(old_address)) {
                error("gc_move(): GC invariant failure -- old address points to new space %p", old_address);

                /* else see if not  in old space */
            } else if (!IN_OLDSPACE(old_address)) {
                replacement = old_address;
                old_address = previous_object;
                break;

                /* else see if already forwarded */
            } else if (IS_GCDONE(old_address))  {
                if (IS_BINOBJ(old_address)) {
                    /* reuse class element. */
                    replacement = old_address->data[0];
                } else {
                    sz = SIZE(old_address);
                    replacement = old_address->data[sz];
                }
                old_address = previous_object;
                break;

                /* else see if binary object */
            } else if (IS_BINOBJ(old_address)) {
                int isz;

                isz = SIZE(old_address);
                sz = TO_WORDS(isz);
                memoryPointer = WORDSDOWN(memoryPointer,
                                          sz + 2);
                new_address = (struct mobject *)memoryPointer;
                SET_SIZE(new_address, isz);
                SET_BINOBJ(new_address);
                /* FIXME - use memcpy */
                while (sz) {
                    new_address->data[sz] =
                        old_address->data[sz];
                    sz--;
                }
                SET_GCDONE(old_address);
                new_address->data[0] = previous_object;
                previous_object = old_address;
                old_address = old_address->data[0];
                previous_object->data[0] = new_address;
                /* now go chase down class pointer */

                /* must be non-binary object */
            } else  {
                sz = SIZE(old_address);
                memoryPointer = WORDSDOWN(memoryPointer,
                                          sz + 2);
                new_address = (struct mobject *)memoryPointer;
                SET_SIZE(new_address, sz);
                SET_GCDONE(old_address);
                new_address->data[sz] = previous_object;
                previous_object = old_address;
                old_address = old_address->data[sz];
                previous_object->data[sz] = new_address;
            }
        }

        /*
         * part 2.  Fix up pointers,
         * move back up tree as long as possible
         * old_address points to an object in the old space,
         * which in turns points to an object in the new space,
         * which holds a pointer that is now to be replaced.
         * the value in replacement is the new value
         */
        for (;;) {
            /* backed out entirely */
            if (old_address == 0) {
                return (struct object *) replacement;
            }

            /* case 1, binary or last value */
            if (IS_BINOBJ(old_address) ||
                (SIZE(old_address) == 0)) {

                /* fix up class pointer */
                new_address = old_address->data[0];
                previous_object = new_address->data[0];
                new_address->data[0] = replacement;
                old_address->data[0] = new_address;
                replacement = new_address;
                old_address = previous_object;
            } else {
                sz = SIZE(old_address);
                new_address = old_address->data[sz];
                previous_object = new_address->data[sz];
                new_address->data[sz] = replacement;
                sz--;

                /*
                 * quick cheat for recovering zero fields
                 */
                while (sz && (old_address->data[sz] == 0)) {
                    new_address->data[sz--] = 0;
                }

                SET_SIZE(old_address, sz);
                SET_GCDONE(old_address);
                new_address->data[sz] = previous_object;
                previous_object = old_address;
                old_address = old_address->data[sz];
                previous_object->data[sz] = new_address;
                break; /* go track down this value */
            }
        }
    }

    /* make the compiler happy */
    return (struct object *)0;
}